

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O2

S1ChordAngle __thiscall S2Cell::GetDistance(S2Cell *this,S2Cell *target)

{
  S2Point *x;
  S1ChordAngle SVar1;
  bool bVar2;
  uint uVar3;
  int i;
  long lVar4;
  S2Point *a;
  long lVar5;
  S2Point *a_00;
  S1ChordAngle local_128;
  long local_120;
  S2Point *local_118;
  S2Point local_110;
  S2Point vb [4];
  S2Point va [4];
  
  if (this->face_ == target->face_) {
    bVar2 = R2Rect::Intersects(&this->uv_,&target->uv_);
    if (bVar2) {
      SVar1 = S1ChordAngle::Zero();
      return (S1ChordAngle)SVar1.length2_;
    }
  }
  va[3].c_[1] = 0.0;
  va[3].c_[2] = 0.0;
  va[2].c_[2] = 0.0;
  va[3].c_[0] = 0.0;
  va[2].c_[0] = 0.0;
  va[2].c_[1] = 0.0;
  va[1].c_[1] = 0.0;
  va[1].c_[2] = 0.0;
  va[0].c_[2] = 0.0;
  va[1].c_[0] = 0.0;
  va[0].c_[0] = 0.0;
  va[0].c_[1] = 0.0;
  vb[3].c_[1] = 0.0;
  vb[3].c_[2] = 0.0;
  vb[2].c_[2] = 0.0;
  vb[3].c_[0] = 0.0;
  vb[2].c_[0] = 0.0;
  vb[2].c_[1] = 0.0;
  vb[1].c_[1] = 0.0;
  vb[1].c_[2] = 0.0;
  vb[0].c_[2] = 0.0;
  vb[1].c_[0] = 0.0;
  vb[0].c_[0] = 0.0;
  vb[0].c_[1] = 0.0;
  lVar5 = 0;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    GetVertex(&local_110,this,(int)lVar4);
    *(VType *)((long)va[0].c_ + lVar5 + 0x10) = local_110.c_[2];
    *(VType *)((long)va[0].c_ + lVar5) = local_110.c_[0];
    *(VType *)((long)va[0].c_ + lVar5 + 8) = local_110.c_[1];
    GetVertex(&local_110,target,(int)lVar4);
    *(VType *)((long)vb[0].c_ + lVar5 + 0x10) = local_110.c_[2];
    *(VType *)((long)vb[0].c_ + lVar5) = local_110.c_[0];
    *(VType *)((long)vb[0].c_ + lVar5 + 8) = local_110.c_[1];
    lVar5 = lVar5 + 0x18;
  }
  local_128 = S1ChordAngle::Infinity();
  for (local_120 = 0; local_120 != 4; local_120 = local_120 + 1) {
    local_118 = va + local_120;
    x = vb + local_120;
    a = vb;
    a_00 = va;
    for (lVar4 = 1; lVar4 != 5; lVar4 = lVar4 + 1) {
      uVar3 = (uint)lVar4 & 3;
      S2::UpdateMinDistance(local_118,a,vb + uVar3,&local_128);
      S2::UpdateMinDistance(x,a_00,va + uVar3,&local_128);
      a_00 = a_00 + 1;
      a = a + 1;
    }
  }
  return (S1ChordAngle)local_128.length2_;
}

Assistant:

S1ChordAngle S2Cell::GetDistance(const S2Cell& target) const {
  // If the cells intersect, the distance is zero.  We use the (u,v) ranges
  // rather S2CellId::intersects() so that cells that share a partial edge or
  // corner are considered to intersect.
  if (face_ == target.face_ && uv_.Intersects(target.uv_)) {
    return S1ChordAngle::Zero();
  }

  // Otherwise, the minimum distance always occurs between a vertex of one
  // cell and an edge of the other cell (including the edge endpoints).  This
  // represents a total of 32 possible (vertex, edge) pairs.
  //
  // TODO(ericv): This could be optimized to be at least 5x faster by pruning
  // the set of possible closest vertex/edge pairs using the faces and (u,v)
  // ranges of both cells.
  S2Point va[4], vb[4];
  for (int i = 0; i < 4; ++i) {
    va[i] = GetVertex(i);
    vb[i] = target.GetVertex(i);
  }
  S1ChordAngle min_dist = S1ChordAngle::Infinity();
  for (int i = 0; i < 4; ++i) {
    for (int j = 0; j < 4; ++j) {
      S2::UpdateMinDistance(va[i], vb[j], vb[(j + 1) & 3], &min_dist);
      S2::UpdateMinDistance(vb[i], va[j], va[(j + 1) & 3], &min_dist);
    }
  }
  return min_dist;
}